

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O2

_Bool tval_can_have_flavor_k(object_kind *kind)

{
  return (_Bool)((byte)(0x27f00000 >> ((byte)kind->tval & 0x1f)) & (uint)kind->tval < 0x1e);
}

Assistant:

bool tval_can_have_flavor_k(const struct object_kind *kind)
{
	switch (kind->tval) {
		case TV_AMULET:
		case TV_RING:
		case TV_STAFF:
		case TV_WAND:
		case TV_ROD:
		case TV_POTION:
		case TV_MUSHROOM:
		case TV_SCROLL:
			return true;
		default:
			return false;
	}
}